

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O2

ssize_t __thiscall QBmpHandler::write(QBmpHandler *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  Format FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QIODevice *pQVar7;
  QDataStream *pQVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint bpl;
  undefined4 in_register_00000034;
  QImage *this_00;
  long lVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  undefined1 local_88 [16];
  QImageData *local_78;
  undefined4 local_68;
  int local_64;
  undefined4 local_60;
  int local_5c;
  undefined1 local_58 [16];
  QImageData *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  this_00 = (QImage *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_88);
  FVar2 = QImage::format(this_00);
  if (FVar2 < Format_RGBX64) {
    if ((0x3aU >> (FVar2 & Format_RGBA16FPx4) & 1) != 0) {
      QImage::operator=((QImage *)local_88,this_00);
      goto LAB_002569a5;
    }
    if ((0x1800000U >> (FVar2 & Format_RGBA16FPx4) & 1) == 0) {
      if (FVar2 != Format_MonoLSB) goto LAB_0025696d;
      FVar2 = Format_Mono;
    }
    else {
      FVar2 = Format_Indexed8;
    }
  }
  else {
LAB_0025696d:
    bVar1 = QImage::hasAlphaChannel(this_00);
    if (bVar1) {
      FVar2 = Format_ARGB32;
    }
    else {
      FVar2 = Format_RGB32;
    }
  }
  QImage::convertToFormat_helper((QImage *)local_58,this_00,FVar2,(ImageConversionFlags)0x0);
  QImage::operator=((QImage *)local_88,(QImage *)local_58);
  QImage::~QImage((QImage *)local_58);
LAB_002569a5:
  iVar3 = QImage::width((QImage *)local_88);
  iVar4 = QImage::depth((QImage *)local_88);
  bpl = iVar4 * iVar3 + 0x1f >> 3 & 0xfffffffc;
  uVar10 = (ulong)(int)bpl;
  iVar3 = QImage::depth((QImage *)local_88);
  if ((iVar3 == 8) && (iVar3 = QImage::colorCount((QImage *)local_88), iVar3 < 0x11)) {
    uVar10 = ((long)(uVar10 | 1) / 2 + 3) / 4 << 2;
    iVar3 = 4;
  }
  else {
    iVar3 = QImage::depth((QImage *)local_88);
    if (iVar3 == 0x20) {
      iVar3 = QImage::width((QImage *)local_88);
      uVar10 = (ulong)((iVar3 * 0x18 + 0x1f) / 0x20 << 2);
      iVar3 = 0x18;
    }
    else {
      iVar3 = QImage::depth((QImage *)local_88);
    }
  }
  iVar4 = (int)uVar10;
  if ((long)iVar4 == uVar10) {
    if (this->m_format == DibFormat) {
      local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar7 = QImageIOHandler::device(&this->super_QImageIOHandler);
      QDataStream::QDataStream((QDataStream *)local_58,pQVar7);
      QDataStream::setByteOrder((ByteOrder)(QDataStream *)local_58);
      bVar1 = qt_write_dib((QDataStream *)local_58,this_00,bpl,iVar4,iVar3);
      uVar10 = CONCAT71(extraout_var_00,bVar1) & 0xffffffff;
    }
    else {
      pQVar7 = QImageIOHandler::device(&this->super_QImageIOHandler);
      local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::QDataStream((QDataStream *)local_58,pQVar7);
      local_68 = 0xaaaaaaaa;
      QDataStream::setByteOrder((ByteOrder)(QDataStream *)local_58);
      local_68 = CONCAT22(local_68._2_2_,0x4d42);
      local_60 = 0;
      iVar5 = QImage::colorCount((QImage *)local_88);
      local_5c = iVar5 * 4 + 0x36;
      iVar6 = QImage::height((QImage *)local_88);
      local_64 = iVar6 * iVar4 + iVar5 * 4 + 0x36;
      lVar9 = (long)local_64;
      iVar6 = QImage::height((QImage *)local_88);
      if (uVar10 * (long)iVar6 + (long)(iVar5 << 2) + 0x36 == lVar9) {
        QDataStream::writeRawData((char *)local_58,(longlong)&local_68);
        pQVar8 = (QDataStream *)QDataStream::operator<<((QDataStream *)local_58,local_64);
        pQVar8 = (QDataStream *)QDataStream::operator<<(pQVar8,(short)local_60);
        pQVar8 = (QDataStream *)QDataStream::operator<<(pQVar8,local_60._2_2_);
        QDataStream::operator<<(pQVar8,local_5c);
        bVar1 = qt_write_dib((QDataStream *)local_58,(QImage *)local_88,bpl,iVar4,iVar3);
        uVar10 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
      }
      else {
        uVar10 = 0;
      }
    }
    QDataStream::~QDataStream((QDataStream *)local_58);
  }
  else {
    uVar10 = 0;
  }
  QImage::~QImage((QImage *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar10;
}

Assistant:

bool QBmpHandler::write(const QImage &img)
{
    QImage image;
    switch (img.format()) {
    case QImage::Format_Mono:
    case QImage::Format_Indexed8:
    case QImage::Format_RGB32:
    case QImage::Format_ARGB32:
        image = img;
        break;
    case QImage::Format_MonoLSB:
        image = img.convertToFormat(QImage::Format_Mono);
        break;
    case QImage::Format_Alpha8:
    case QImage::Format_Grayscale8:
        image = img.convertToFormat(QImage::Format_Indexed8);
        break;
    default:
        if (img.hasAlphaChannel())
            image = img.convertToFormat(QImage::Format_ARGB32);
        else
            image = img.convertToFormat(QImage::Format_RGB32);
        break;
    }

    int nbits;
    qsizetype bpl_bmp;
    // Calculate a minimum bytes-per-line instead of using whatever value this QImage is using internally.
    qsizetype bpl = ((image.width() * image.depth() + 31) >> 5) << 2;

    if (image.depth() == 8 && image.colorCount() <= 16) {
        bpl_bmp = (((bpl+1)/2+3)/4)*4;
        nbits = 4;
   } else if (image.depth() == 32) {
        bpl_bmp = ((image.width()*24+31)/32)*4;
        nbits = 24;
    } else {
        bpl_bmp = bpl;
        nbits = image.depth();
    }
    if (qsizetype(int(bpl_bmp)) != bpl_bmp)
        return false;

    if (m_format == DibFormat) {
        QDataStream dibStream(device());
        dibStream.setByteOrder(QDataStream::LittleEndian); // Intel byte order
        return qt_write_dib(dibStream, img, bpl, bpl_bmp, nbits);
    }

    QIODevice *d = device();
    QDataStream s(d);
    BMP_FILEHDR bf;

    // Intel byte order
    s.setByteOrder(QDataStream::LittleEndian);

    // build file header
    memcpy(bf.bfType, "BM", 2);

    // write file header
    bf.bfReserved1 = 0;
    bf.bfReserved2 = 0;
    bf.bfOffBits = BMP_FILEHDR_SIZE + BMP_WIN + image.colorCount() * 4;
    bf.bfSize = bf.bfOffBits + bpl_bmp*image.height();
    if (qsizetype(bf.bfSize) != bf.bfOffBits + bpl_bmp*image.height())
        return false;
    s << bf;

    // write image
    return qt_write_dib(s, image, bpl, bpl_bmp, nbits);
}